

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::deleteCurrent(QFileDialogPrivate *this)

{
  ushort uVar1;
  bool bVar2;
  int value;
  StandardButton SVar3;
  uint uVar4;
  ulong uVar5;
  reference pQVar6;
  QWidget *this_00;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  Permissions p;
  QString filePath;
  QString fileName;
  QPersistentModelIndex index;
  const_reverse_iterator end;
  const_reverse_iterator it;
  QModelIndexList list;
  undefined4 in_stack_fffffffffffffd18;
  Permission in_stack_fffffffffffffd1c;
  QFileSystemModel *in_stack_fffffffffffffd20;
  QWidget *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  QFileDialogPrivate *in_stack_fffffffffffffd38;
  QFileSystemModel *in_stack_fffffffffffffd40;
  byte local_2b1;
  undefined1 uVar7;
  QChar in_stack_fffffffffffffd6e;
  Permission local_26c;
  QPersistentModelIndex local_260 [10];
  QPersistentModelIndex local_210 [3];
  QFileInfo local_1f8 [8];
  QPersistentModelIndex local_1f0 [3];
  QChar local_1d2 [40];
  QChar local_182 [39];
  QFlagsStorageHelper<QFileDevice::Permission,_4> local_134 [7];
  QFlag local_118;
  undefined4 local_114;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8 [48];
  QPersistentModelIndex local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = QFileSystemModel::isReadOnly();
  if ((uVar5 & 1) == 0) {
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffd20);
    QItemSelectionModel::selectedRows((int)&local_80);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::crbegin((QList<QModelIndex> *)in_stack_fffffffffffffd28);
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::crend((QList<QModelIndex> *)in_stack_fffffffffffffd28);
    while (bVar2 = std::operator!=((reverse_iterator<QList<QModelIndex>::const_iterator> *)
                                   in_stack_fffffffffffffd20,
                                   (reverse_iterator<QList<QModelIndex>::const_iterator> *)
                                   CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)),
          bVar2) {
      local_98.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = std::reverse_iterator<QList<QModelIndex>::const_iterator>::operator*
                         ((reverse_iterator<QList<QModelIndex>::const_iterator> *)
                          in_stack_fffffffffffffd20);
      QPersistentModelIndex::QPersistentModelIndex(&local_98,(QModelIndex *)pQVar6);
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&in_RDI->qFileDialogUi);
      QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_fffffffffffffd20);
      bVar2 = ::operator==((QPersistentModelIndex *)in_stack_fffffffffffffd20,
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      if (bVar2) {
        local_26c = ReadOther;
      }
      else {
        QPersistentModelIndex::row();
        QPersistentModelIndex::sibling((int)local_e0,(int)&local_98);
        mapToSource((QFileDialogPrivate *)
                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                    (QModelIndex *)in_stack_fffffffffffffd28);
        QPersistentModelIndex::operator=(&local_98,(QModelIndex *)local_c8);
        uVar5 = QPersistentModelIndex::isValid();
        if ((uVar5 & 1) == 0) {
          local_26c = ReadOther;
        }
        else {
          local_f8 = &DAT_aaaaaaaaaaaaaaaa;
          local_f0 = &DAT_aaaaaaaaaaaaaaaa;
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::data((int)&local_28);
          ::QVariant::toString();
          ::QVariant::~QVariant(&local_28);
          local_110 = &DAT_aaaaaaaaaaaaaaaa;
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          local_100 = &DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::data((int)&local_48);
          ::QVariant::toString();
          ::QVariant::~QVariant(&local_48);
          local_114 = 0xaaaaaaaa;
          QPersistentModelIndex::parent();
          QModelIndex::data((QModelIndex *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
          value = ::QVariant::toInt((bool *)&local_68);
          QFlag::QFlag(&local_118,value);
          QFlags<QFileDevice::Permission>::QFlagsStorageHelper
                    ((QFlags<QFileDevice::Permission> *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     (QFlag)(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
          ::QVariant::~QVariant(&local_68);
          this_00 = (QWidget *)q_func(in_RDI);
          local_134[0].super_QFlagsStorage<QFileDevice::Permission>.i =
               (QFlagsStorage<QFileDevice::Permission>)
               QFlags<QFileDevice::Permission>::operator&
                         ((QFlags<QFileDevice::Permission> *)in_stack_fffffffffffffd20,
                          in_stack_fffffffffffffd1c);
          bVar2 = QFlags<QFileDevice::Permission>::operator!
                            ((QFlags<QFileDevice::Permission> *)local_134);
          in_stack_fffffffffffffd6e.ucs = in_stack_fffffffffffffd6e.ucs & 0xff;
          if (bVar2) {
            q_func(in_RDI);
            QFileDialog::tr((char *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                            in_stack_fffffffffffffd1c);
            QFileDialog::tr((char *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                            in_stack_fffffffffffffd1c);
            QChar::QChar<char16_t,_true>(local_182,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffd40,(QString *)in_stack_fffffffffffffd38,
                       in_stack_fffffffffffffd34,in_stack_fffffffffffffd6e);
            uVar7 = (undefined1)in_stack_fffffffffffffd6e.ucs;
            ::operator|((enum_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                        (enum_type)in_stack_fffffffffffffd20);
            SVar3 = QMessageBox::warning
                              ((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (QString *)in_stack_fffffffffffffd28,
                               (QString *)in_stack_fffffffffffffd20,
                               (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)
                               SUB84((ulong)in_stack_fffffffffffffd38 >> 0x20,0),
                               in_stack_fffffffffffffd1c);
            in_stack_fffffffffffffd6e.ucs = CONCAT11(SVar3 == No,uVar7);
          }
          uVar1 = (ushort)in_stack_fffffffffffffd6e.ucs >> 8;
          if (bVar2) {
            QString::~QString((QString *)0x75ef9e);
            QString::~QString((QString *)0x75efb4);
            QString::~QString((QString *)0x75efca);
          }
          if ((char)uVar1 == '\0') {
            q_func(in_RDI);
            QFileDialog::tr((char *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                            in_stack_fffffffffffffd1c);
            QFileDialog::tr((char *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                            in_stack_fffffffffffffd1c);
            QChar::QChar<char16_t,_true>(local_1d2,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffd40,(QString *)in_stack_fffffffffffffd38,
                       in_stack_fffffffffffffd34,in_stack_fffffffffffffd6e);
            ::operator|((enum_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                        (enum_type)in_stack_fffffffffffffd20);
            SVar3 = QMessageBox::warning
                              ((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (QString *)in_stack_fffffffffffffd28,
                               (QString *)in_stack_fffffffffffffd20,
                               (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)
                               SUB84((ulong)in_stack_fffffffffffffd38 >> 0x20,0),
                               in_stack_fffffffffffffd1c);
            QString::~QString((QString *)0x75f0ac);
            QString::~QString((QString *)0x75f0b9);
            QString::~QString((QString *)0x75f0c6);
            if (SVar3 == No) {
              local_26c = ExeOther;
            }
            else {
              uVar5 = QPersistentModelIndex::isValid();
              if ((uVar5 & 1) == 0) {
                local_26c = ExeOther;
              }
              else {
                in_stack_fffffffffffffd40 = in_RDI->model;
                QPersistentModelIndex::operator_cast_to_QModelIndex(local_1f0);
                uVar4 = QFileSystemModel::isDir((QModelIndex *)in_stack_fffffffffffffd40);
                bVar2 = (uVar4 & 1) != 0;
                local_2b1 = 0;
                if (bVar2) {
                  in_stack_fffffffffffffd38 = (QFileDialogPrivate *)in_RDI->model;
                  QPersistentModelIndex::operator_cast_to_QModelIndex(local_210);
                  QFileSystemModel::fileInfo((QModelIndex *)local_1f8);
                  local_2b1 = QFileInfo::isSymLink();
                  local_2b1 = local_2b1 ^ 0xff;
                }
                in_stack_fffffffffffffd34 = CONCAT13(local_2b1,(int3)in_stack_fffffffffffffd34);
                if (bVar2) {
                  QFileInfo::~QFileInfo(local_1f8);
                }
                if ((in_stack_fffffffffffffd34 & 0x1000000) == 0) {
                  in_stack_fffffffffffffd20 = in_RDI->model;
                  QPersistentModelIndex::operator_cast_to_QModelIndex(local_260);
                  QFileSystemModel::remove((QModelIndex *)in_stack_fffffffffffffd20);
                }
                else {
                  bVar2 = removeDirectory(in_stack_fffffffffffffd38,
                                          (QString *)
                                          CONCAT44(in_stack_fffffffffffffd34,
                                                   in_stack_fffffffffffffd30));
                  if (!bVar2) {
                    QWidget::windowTitle(this_00);
                    QFileDialog::tr((char *)this_00,(char *)in_stack_fffffffffffffd20,
                                    in_stack_fffffffffffffd1c);
                    QFlags<QMessageBox::StandardButton>::QFlags
                              ((QFlags<QMessageBox::StandardButton> *)in_stack_fffffffffffffd20,
                               in_stack_fffffffffffffd1c);
                    QMessageBox::warning
                              ((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (QString *)this_00,(QString *)in_stack_fffffffffffffd20,
                               (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)
                               SUB84((ulong)in_stack_fffffffffffffd38 >> 0x20,0),
                               in_stack_fffffffffffffd1c);
                    QString::~QString((QString *)0x75f263);
                    QString::~QString((QString *)0x75f270);
                    in_stack_fffffffffffffd28 = this_00;
                  }
                }
                local_26c = 0;
              }
            }
          }
          else {
            local_26c = ExeOther;
          }
          QString::~QString((QString *)0x75f2bf);
          QString::~QString((QString *)0x75f2cc);
        }
      }
      QPersistentModelIndex::~QPersistentModelIndex(&local_98);
      if ((local_26c != 0) && (local_26c != ReadOther)) break;
      std::reverse_iterator<QList<QModelIndex>::const_iterator>::operator++
                ((reverse_iterator<QList<QModelIndex>::const_iterator> *)in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd1c = local_26c;
    }
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x75f31b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::deleteCurrent()
{
    if (model->isReadOnly())
        return;

    const QModelIndexList list = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (auto it = list.crbegin(), end = list.crend(); it != end; ++it) {
        QPersistentModelIndex index = *it;
        if (index == qFileDialogUi->listView->rootIndex())
            continue;

        index = mapToSource(index.sibling(index.row(), 0));
        if (!index.isValid())
            continue;

        QString fileName = index.data(QFileSystemModel::FileNameRole).toString();
        QString filePath = index.data(QFileSystemModel::FilePathRole).toString();

        QFile::Permissions p(index.parent().data(QFileSystemModel::FilePermissions).toInt());
#if QT_CONFIG(messagebox)
        Q_Q(QFileDialog);
        if (!(p & QFile::WriteUser) && (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                    QFileDialog::tr("'%1' is write protected.\nDo you want to delete it anyway?")
                                    .arg(fileName),
                                     QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No))
            return;
        else if (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                      QFileDialog::tr("Are you sure you want to delete '%1'?")
                                      .arg(fileName),
                                      QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No)
            return;

        // the event loop has run, we have to validate if the index is valid because the model might have removed it.
        if (!index.isValid())
            return;

#else
        if (!(p & QFile::WriteUser))
            return;
#endif // QT_CONFIG(messagebox)

        if (model->isDir(index) && !model->fileInfo(index).isSymLink()) {
            if (!removeDirectory(filePath)) {
#if QT_CONFIG(messagebox)
            QMessageBox::warning(q, q->windowTitle(),
                                QFileDialog::tr("Could not delete directory."));
#endif
            }
        } else {
            model->remove(index);
        }
    }
}